

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O2

ExtPubkey * __thiscall
cfd::core::ExtPrivkey::DerivePubkey
          (ExtPubkey *__return_storage_ptr__,ExtPrivkey *this,string *string_path)

{
  ExtPrivkey privkey;
  ExtPrivkey EStack_88;
  
  DerivePrivkey(&EStack_88,this,string_path);
  GetExtPubkey(__return_storage_ptr__,&EStack_88);
  ~ExtPrivkey(&EStack_88);
  return __return_storage_ptr__;
}

Assistant:

ExtPubkey ExtPrivkey::DerivePubkey(const std::string& string_path) const {
  ExtPrivkey privkey = DerivePrivkey(string_path);
  return privkey.GetExtPubkey();
}